

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O0

shared_ptr<const_Assimp::FIValue> __thiscall
Assimp::FILongDecoder::decode(FILongDecoder *this,uint8_t *data,size_t len)

{
  DeadlyImportError *this_00;
  ulong in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<const_Assimp::FIValue> sVar1;
  pointer local_a8;
  int64_t v;
  int64_t b7;
  int64_t b6;
  int64_t b5;
  int64_t b4;
  int64_t b3;
  int64_t b2;
  int64_t b1;
  int64_t b0;
  size_t i;
  size_t numLongs;
  vector<long,_std::allocator<long>_> value;
  size_t len_local;
  uint8_t *data_local;
  FILongDecoder *this_local;
  
  if ((in_RCX & 7) != 0) {
    this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    DeadlyImportError::DeadlyImportError(this_00,(string *)parseErrorMessage_abi_cxx11_);
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  std::vector<long,_std::allocator<long>_>::vector((vector<long,_std::allocator<long>_> *)&numLongs)
  ;
  i = in_RCX >> 3;
  std::vector<long,_std::allocator<long>_>::reserve
            ((vector<long,_std::allocator<long>_> *)&numLongs,i);
  len_local = len;
  for (b0 = 0; (ulong)b0 < i; b0 = b0 + 1) {
    b1 = (int64_t)*(byte *)len_local;
    b2 = (int64_t)*(byte *)(len_local + 1);
    b3 = (int64_t)*(byte *)(len_local + 2);
    b4 = (int64_t)*(byte *)(len_local + 3);
    b5 = (int64_t)*(byte *)(len_local + 4);
    b6 = (int64_t)*(byte *)(len_local + 5);
    b7 = (int64_t)*(byte *)(len_local + 6);
    v = (int64_t)*(byte *)(len_local + 7);
    local_a8 = (pointer)(b1 << 0x38 | b2 << 0x30 | b3 << 0x28 | b4 << 0x20 | b5 << 0x18 | b6 << 0x10
                         | b7 << 8 | v);
    std::vector<long,_std::allocator<long>_>::push_back
              ((vector<long,_std::allocator<long>_> *)&numLongs,
               (value_type_conflict8 *)&stack0xffffffffffffff58);
    len_local = len_local + 8;
  }
  FILongValue::create((FILongValue *)&stack0xffffffffffffff48,
                      (vector<long,_std::allocator<long>_> *)&numLongs);
  std::shared_ptr<Assimp::FIValue_const>::shared_ptr<Assimp::FILongValue,void>
            ((shared_ptr<Assimp::FIValue_const> *)this,
             (shared_ptr<Assimp::FILongValue> *)&stack0xffffffffffffff48);
  std::shared_ptr<Assimp::FILongValue>::~shared_ptr
            ((shared_ptr<Assimp::FILongValue> *)&stack0xffffffffffffff48);
  std::vector<long,_std::allocator<long>_>::~vector
            ((vector<long,_std::allocator<long>_> *)&numLongs);
  sVar1.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<const_Assimp::FIValue>)
         sVar1.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual std::shared_ptr<const FIValue> decode(const uint8_t *data, size_t len) /*override*/ {
        if (len & 7) {
            throw DeadlyImportError(parseErrorMessage);
        }
        std::vector<int64_t> value;
        size_t numLongs = len / 8;
        value.reserve(numLongs);
        for (size_t i = 0; i < numLongs; ++i) {
            int64_t b0 = data[0], b1 = data[1], b2 = data[2], b3 = data[3], b4 = data[4], b5 = data[5], b6 = data[6], b7 = data[7];
            int64_t v = (b0 << 56) | (b1 << 48) | (b2 << 40) | (b3 << 32) | (b4 << 24) | (b5 << 16) | (b6 << 8) | b7;
            value.push_back(v);
            data += 8;
        }
        return FILongValue::create(std::move(value));
    }